

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall
PreciseMeasurement_conversions_Test::TestBody(PreciseMeasurement_conversions_Test *this)

{
  unit_data *puVar1;
  double lhs_value;
  bool bVar2;
  char *pcVar3;
  precise_unit pVar4;
  AssertHelper local_260;
  Message local_258;
  precise_unit local_250;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_9;
  Message local_228;
  precise_unit local_220;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_8;
  Message local_1f8;
  precise_measurement local_1f0;
  precise_unit local_1d8;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_7;
  precise_measurement d5;
  Message local_198;
  double local_190;
  double local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_6;
  precise_measurement d4;
  precise_unit ud4;
  Message local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_5;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_4;
  Message local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_3;
  Message local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_2;
  Message local_c0;
  precise_unit local_b8;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  precise_measurement d3;
  Message local_78 [3];
  precise_unit local_60;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  precise_measurement d2;
  precise_measurement d1;
  PreciseMeasurement_conversions_Test *this_local;
  
  puVar1 = &d2.units_.base_units_;
  units::operator*((precise_measurement *)puVar1,45.0,(precise_unit *)units::precise::ft);
  units::precise_measurement::convert_to_base
            ((precise_measurement *)&gtest_ar.message_,(precise_measurement *)puVar1);
  pVar4 = units::precise_measurement::units((precise_measurement *)&gtest_ar.message_);
  local_60._8_8_ = pVar4._8_8_;
  local_60.multiplier_ = pVar4.multiplier_;
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_50,"d2.units()","precise::m",&local_60,
             (precise_unit *)units::precise::m);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar2) {
    testing::Message::Message(local_78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&d3.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x237,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&d3.units_.base_units_,local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&d3.units_.base_units_);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  units::precise_measurement::convert_to
            ((precise_measurement *)&gtest_ar_1.message_,
             (precise_measurement *)&d2.units_.base_units_,(precise_unit *)units::precise::in);
  pVar4 = units::precise_measurement::units((precise_measurement *)&gtest_ar_1.message_);
  local_b8._8_8_ = pVar4._8_8_;
  local_b8.multiplier_ = pVar4.multiplier_;
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_a8,"d3.units()","precise::in",&local_b8,
             (precise_unit *)units::precise::in);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar2) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x23a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  testing::internal::EqHelper::
  Compare<units::precise_measurement,_units::precise_measurement,_nullptr>
            ((EqHelper *)local_d8,"d1","d2",(precise_measurement *)&d2.units_.base_units_,
             (precise_measurement *)&gtest_ar.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar2) {
    testing::Message::Message(&local_e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x23c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  testing::internal::EqHelper::
  Compare<units::precise_measurement,_units::precise_measurement,_nullptr>
            ((EqHelper *)local_f8,"d2","d3",(precise_measurement *)&gtest_ar.message_,
             (precise_measurement *)&gtest_ar_1.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar2) {
    testing::Message::Message(&local_100);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x23d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  testing::internal::EqHelper::
  Compare<units::precise_measurement,_units::precise_measurement,_nullptr>
            ((EqHelper *)local_118,"d3","d1",(precise_measurement *)&gtest_ar_1.message_,
             (precise_measurement *)&d2.units_.base_units_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar2) {
    testing::Message::Message(&local_120);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x23e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  testing::internal::EqHelper::
  Compare<units::precise_measurement,_units::precise_measurement,_nullptr>
            ((EqHelper *)local_138,"d1","d3",(precise_measurement *)&d2.units_.base_units_,
             (precise_measurement *)&gtest_ar_1.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar2) {
    testing::Message::Message(&local_140);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ud4.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x23f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ud4.base_units_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ud4.base_units_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  puVar1 = &d2.units_.base_units_;
  pVar4 = units::precise_measurement::as_unit((precise_measurement *)puVar1);
  ud4.multiplier_ = pVar4._8_8_;
  d4.units_._8_8_ = pVar4.multiplier_;
  units::precise_measurement::convert_to
            ((precise_measurement *)&gtest_ar_6.message_,(precise_measurement *)puVar1,
             (precise_unit *)&d4.units_.base_units_);
  local_188 = units::precise_measurement::value((precise_measurement *)&gtest_ar_6.message_);
  local_190 = 1.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_180,"d4.value()","1.0",&local_188,&local_190);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar2) {
    testing::Message::Message(&local_198);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&d5.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x243,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&d5.units_.base_units_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&d5.units_.base_units_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  gtest_ar_7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4008000000000000;
  d5.value_ = 0.3048;
  d5.units_.multiplier_ = 4.94065645841247e-324;
  units::precise_measurement::convert_to_base
            (&local_1f0,(precise_measurement *)&gtest_ar_7.message_);
  pVar4 = units::precise_measurement::units(&local_1f0);
  local_1d8._8_8_ = pVar4._8_8_;
  local_1d8.multiplier_ = pVar4.multiplier_;
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_1c8,"d5.convert_to_base().units()","precise::m",&local_1d8,
             (precise_unit *)units::precise::m);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar2) {
    testing::Message::Message(&local_1f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x247,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  pVar4 = units::precise_measurement::as_unit((precise_measurement *)&gtest_ar_7.message_);
  local_220._8_8_ = pVar4._8_8_;
  local_220.multiplier_ = pVar4.multiplier_;
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_210,"d5.as_unit()","precise::yd",&local_220,
             (precise_unit *)units::precise::yd);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar2) {
    testing::Message::Message(&local_228);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x24d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  pVar4 = units::precise_measurement::as_unit((precise_measurement *)&gtest_ar_7.message_);
  local_250._8_8_ = pVar4._8_8_;
  local_250.multiplier_ = pVar4.multiplier_;
  lhs_value = units::quick_convert<units::precise_unit,units::precise_unit>
                        (1.0,&local_250,(precise_unit *)units::precise::yd);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_240,"quick_convert(1.0, d5.as_unit(), precise::yd)","1.0",lhs_value,
             1.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar2) {
    testing::Message::Message(&local_258);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x24e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_260,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  return;
}

Assistant:

TEST(PreciseMeasurement, conversions)
{
    auto d1 = 45.0 * precise::ft;
    auto d2 = d1.convert_to_base();
    EXPECT_EQ(d2.units(), precise::m);

    auto d3 = d1.convert_to(precise::in);
    EXPECT_EQ(d3.units(), precise::in);

    EXPECT_EQ(d1, d2);
    EXPECT_EQ(d2, d3);
    EXPECT_EQ(d3, d1);
    EXPECT_EQ(d1, d3);

    auto ud4 = d1.as_unit();
    auto d4 = d1.convert_to(ud4);
    EXPECT_EQ(d4.value(), 1.0);

    constexpr auto d5 = precise::ft * 3.0;
    // convert to base
    EXPECT_EQ(d5.convert_to_base().units(), precise::m);
    static_assert(
        (3.0 * precise::ft).convert_to_base().units().base_units() ==
            precise::m.base_units(),
        "constexpr convert_to_base not working");

    EXPECT_EQ(d5.as_unit(), precise::yd);
    EXPECT_DOUBLE_EQ(quick_convert(1.0, d5.as_unit(), precise::yd), 1.0);
    // static_assert(==1.0, "constexpr convert_to_base not working");
}